

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

tm * ImPlot::GetLocTime(ImPlotTime *t,tm *ptm)

{
  tm *ptVar1;
  
  ptVar1 = localtime_r(&t->S,(tm *)ptm);
  return (tm *)ptVar1;
}

Assistant:

tm* GetLocTime(const ImPlotTime& t, tm* ptm) {
#ifdef _WIN32
  if (localtime_s(ptm, &t.S) == 0)
    return ptm;
  else
    return NULL;
#else
    return localtime_r(&t.S, ptm);
#endif
}